

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void MOJOSHADER_freeCompileData(MOJOSHADER_compileData *_data)

{
  void *pvVar1;
  code *UNRECOVERED_JUMPTABLE;
  MOJOSHADER_compileData *data;
  long lVar2;
  long lVar3;
  
  if (_data == &MOJOSHADER_out_of_mem_compile_data || _data == (MOJOSHADER_compileData *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = _data->free;
  if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
    UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
  }
  pvVar1 = _data->malloc_data;
  if (0 < _data->error_count) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->errors->error + lVar3),pvVar1);
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->errors->filename + lVar3),pvVar1);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < _data->error_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->errors,pvVar1);
  if (0 < _data->warning_count) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->warnings->error + lVar3),pvVar1);
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->warnings->filename + lVar3),pvVar1);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < _data->warning_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->warnings,pvVar1);
  if (0 < _data->symbol_count) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->symbols->name + lVar3),pvVar1);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar2 < _data->symbol_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->symbols,pvVar1);
  (*UNRECOVERED_JUMPTABLE)(_data->output,pvVar1);
  (*UNRECOVERED_JUMPTABLE)(_data,pvVar1);
  return;
}

Assistant:

void MOJOSHADER_freeCompileData(const MOJOSHADER_compileData *_data)
{
    MOJOSHADER_compileData *data = (MOJOSHADER_compileData *) _data;
    if ((data == NULL) || (data == &MOJOSHADER_out_of_mem_compile_data))
        return;  // no-op.

    MOJOSHADER_free f = (data->free == NULL) ? MOJOSHADER_internal_free : data->free;
    void *d = data->malloc_data;
    int i;

    // we don't f(data->source_profile), because that's internal static data.

    for (i = 0; i < data->error_count; i++)
    {
        f((void *) data->errors[i].error, d);
        f((void *) data->errors[i].filename, d);
    } // for
    f((void *) data->errors, d);

    for (i = 0; i < data->warning_count; i++)
    {
        f((void *) data->warnings[i].error, d);
        f((void *) data->warnings[i].filename, d);
    } // for
    f((void *) data->warnings, d);

    for (i = 0; i < data->symbol_count; i++)
    {
        f((void *) data->symbols[i].name, d);
        // !!! FIXME: this is missing stuff (including freeing substructs).
    } // for
    f((void *) data->symbols, d);

    f((void *) data->output, d);
    f(data, d);
}